

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

LinkedSection * smalldata_section(GlobalVars *gv)

{
  LinkedSection *pLVar1;
  LinkedSection *pLVar2;
  LinkedSection *pLVar3;
  LinkedSection *pLVar4;
  
  pLVar2 = (LinkedSection *)0x0;
  pLVar3 = (LinkedSection *)0x0;
  pLVar1 = (LinkedSection *)(gv->lnksec).first;
  do {
    do {
      pLVar4 = pLVar1;
      pLVar1 = (LinkedSection *)(pLVar4->n).next;
      if (pLVar1 == (LinkedSection *)0x0) {
        if (pLVar2 == (LinkedSection *)0x0) {
          return pLVar3;
        }
        return pLVar2;
      }
    } while (((pLVar4->flags & 1) == 0) || (pLVar4->size == 0));
    if (pLVar3 == (LinkedSection *)0x0) {
      pLVar3 = pLVar4;
    }
    if ((pLVar4->type == '\x02') || (pLVar2 == (LinkedSection *)0x0 && pLVar4->type == '\x03')) {
      pLVar2 = pLVar4;
    }
  } while ((pLVar4->flags & 4) == 0);
  return pLVar4;
}

Assistant:

struct LinkedSection *smalldata_section(struct GlobalVars *gv)
/* Return pointer to first small data LinkedSection. If not existing, */
/* return first data/bss section or the first section. */
{
  struct LinkedSection *ls = (struct LinkedSection *)gv->lnksec.first;
  struct LinkedSection *ldls=NULL,*firstls=NULL,*nextls;

  while (nextls = (struct LinkedSection *)ls->n.next) {
    if ((ls->flags & SF_ALLOC) && ls->size!=0) {
      if (firstls == NULL)
        firstls = ls;
      if (ls->type==ST_DATA || ls->type==ST_UDATA && ldls==NULL)
        ldls = ls;
      if (ls->flags & SF_SMALLDATA)  /* first SD section found! */
        return ls;
    }
    ls = nextls;
  }
  return ldls ? ldls : firstls;
}